

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_4.cpp
# Opt level: O0

bool is_valid(Date *d)

{
  bool bVar1;
  int iVar2;
  Month MVar3;
  bool is_valid;
  Date *d_local;
  
  iVar2 = Date::year(d);
  bVar1 = false;
  if (0 < iVar2) {
    MVar3 = Date::month(d);
    bVar1 = false;
    if (0 < (int)MVar3) {
      MVar3 = Date::month(d);
      bVar1 = false;
      if ((int)MVar3 < 0xd) {
        iVar2 = Date::day(d);
        bVar1 = 0 < iVar2;
      }
    }
  }
  if (!bVar1) {
    return false;
  }
  MVar3 = Date::month(d);
  bVar1 = is_31_day_month(MVar3);
  if ((bVar1) && (iVar2 = Date::day(d), iVar2 < 0x20)) {
    return true;
  }
  MVar3 = Date::month(d);
  bVar1 = is_30_day_month(MVar3);
  if ((bVar1) && (iVar2 = Date::day(d), iVar2 < 0x1f)) {
    return true;
  }
  MVar3 = Date::month(d);
  if (((MVar3 == feb) && (bVar1 = is_leap(d), bVar1)) && (iVar2 = Date::day(d), iVar2 < 0x1e)) {
    return true;
  }
  iVar2 = Date::day(d);
  return iVar2 < 0x1d;
}

Assistant:

bool is_valid(Date& d)
{
	bool is_valid = d.year() > 0 && (int(d.month()) > 0 && int(d.month()) < 13) && d.day() > 0;
	is_valid = is_valid && (
		(is_31_day_month(d.month()) && d.day() < 32) ||
		(is_30_day_month(d.month()) && d.day() < 31) ||
		(d.month() == Month::feb && (is_leap(d) && d.day() < 30) || d.day() < 29)
		);
	return is_valid;
}